

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

Uint16 X11_KeyToUnicode(SDL12Key key,SDL12Mod mod)

{
  short sVar1;
  bool bVar2;
  int capital;
  int shifted;
  SDL12Mod mod_local;
  SDL12Key key_local;
  
  if ((int)key < 0x7f) {
    mod_local._2_2_ = (undefined2)key;
    if ((SDLK12_BACKQUOTE < key) && (key < 0x7b)) {
      bVar2 = (mod & KMOD12_CAPS) != KMOD12_NONE;
      if ((mod & (KMOD12_RSHIFT|KMOD12_LSHIFT)) != KMOD12_NONE) {
        bVar2 = !bVar2;
      }
      sVar1 = 0x61;
      if (bVar2) {
        sVar1 = 0x41;
      }
      mod_local._2_2_ = sVar1 + (mod_local._2_2_ - 0x61);
    }
  }
  else {
    mod_local._2_2_ = KMOD12_NONE >> 0x10;
  }
  return mod_local._2_2_;
}

Assistant:

SDLCALL
X11_KeyToUnicode(SDL12Key key, SDL12Mod mod)
{
    if (((int) key) >= 127) {
        return 0;
    }
    if ((key >= SDLK12_a) && (key <= SDLK12_z)) {
        const int shifted = ((mod & (KMOD12_LSHIFT|KMOD12_RSHIFT)) != 0) ? 1 : 0;
        int capital = ((mod & KMOD12_CAPS) != 0) ? 1 : 0;
        if (shifted) {
            capital = !capital;
        }
        return (Uint16) ((capital ? 'A' : 'a') + (key - SDLK12_a));
    }

    return (Uint16) key;
}